

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_LocaleCompare
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  FinalizableICUObject<UCollator_*,_&ucol_close_70> *pFVar2;
  DynamicObject *pDVar3;
  bool bVar4;
  UBool UVar5;
  int iVar6;
  CallFlags e;
  BOOL BVar7;
  int iVar8;
  charcount_t cVar9;
  int32 nValue;
  ScriptContext *pSVar10;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar11;
  Var pvVar12;
  JavascriptBoolean *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  JavascriptString *pJVar13;
  LPCSTR pCVar14;
  Recycler *recycler;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  UCollator *pUVar15;
  Var ret;
  char16 *pcStack_1c0;
  charcount_t rightNormalizedLength;
  char16 *rightNormalized;
  char16 *pcStack_1b0;
  charcount_t leftNormalizedLength;
  char16 *leftNormalized;
  ArenaAllocator *tempAllocator;
  TempArenaAllocatorObject *temptempAllocator;
  char16_t cStack_190;
  char16 searchString [7];
  char localeID [157];
  JavascriptString *usage;
  CollatorCaseFirst local_d0;
  PropertyIds local_cc;
  CollatorCaseFirst caseFirst;
  PropertyIds local_c4;
  bool numeric;
  PropertyIds local_bc;
  CollatorSensitivity CStack_b8;
  bool ignorePunctuation;
  PropertyIds local_b4;
  CollatorSensitivity sensitivity;
  JavascriptString *langtag;
  FinalizableICUObject<UCollator_*,_&ucol_close_70> *pFStack_a0;
  UErrorCode status;
  FinalizableUCollator *coll;
  Var cachedUCollator;
  DynamicObject *pDStack_88;
  bool forStringPrototypeLocaleCompare;
  DynamicObject *state;
  JavascriptString *right;
  JavascriptString *left;
  ScriptContext *scriptContext;
  CallInfo CStack_60;
  uint argCount;
  undefined1 local_58 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  Var local_10;
  
  pSVar10 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar10);
  pSVar10 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar10,(PVOID)0x0);
  iVar6 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar6);
  args.Values = (Type)callInfo;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  CStack_60 = callInfo;
  Arguments::Arguments((Arguments *)local_58,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  scriptContext._4_4_ = local_58._0_4_ & 0xffffff;
  left = (JavascriptString *)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x728,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if ((local_58._0_4_ & 0xffffff) == 5) {
    pvVar12 = Arguments::operator[]((Arguments *)local_58,1);
    bVar4 = VarIs<Js::JavascriptString>(pvVar12);
    if (bVar4) {
      pvVar12 = Arguments::operator[]((Arguments *)local_58,2);
      bVar4 = VarIs<Js::JavascriptString>(pvVar12);
      if (bVar4) {
        pvVar12 = Arguments::operator[]((Arguments *)local_58,3);
        bVar4 = DynamicObject::IsBaseDynamicObject(pvVar12);
        if (bVar4) {
          pvVar12 = Arguments::operator[]((Arguments *)local_58,4);
          bVar4 = VarIs<Js::JavascriptBoolean>(pvVar12);
          if (bVar4) goto LAB_010a02f6;
        }
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar11 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0x72f,
                              "((args.Info.Count == 5 && VarIs<JavascriptString>(args[1]) && VarIs<JavascriptString>(args[2]) && DynamicObject::IsBaseDynamicObject(args[3]) && VarIs<JavascriptBoolean>(args[4])))"
                              ,"Intl platform function given bad arguments");
  if (!bVar4) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar11 = 0;
LAB_010a02f6:
  pvVar12 = Arguments::operator[]((Arguments *)local_58,1);
  right = UnsafeVarTo<Js::JavascriptString>(pvVar12);
  pvVar12 = Arguments::operator[]((Arguments *)local_58,2);
  state = (DynamicObject *)UnsafeVarTo<Js::JavascriptString>(pvVar12);
  pvVar12 = Arguments::operator[]((Arguments *)local_58,3);
  pDStack_88 = UnsafeVarTo<Js::DynamicObject>(pvVar12);
  pvVar12 = Arguments::operator[]((Arguments *)local_58,4);
  this_00 = UnsafeVarTo<Js::JavascriptBoolean>(pvVar12);
  BVar7 = JavascriptBoolean::GetValue(this_00);
  cachedUCollator._7_1_ = BVar7 != 0;
  if ((bool)cachedUCollator._7_1_) {
    iVar6 = (*(right->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    iVar8 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    Output::Trace(IntlPhase,L"%S(): Calling \'%s\'.localeCompare(\'%s\', ...)\n",
                  "EntryIntl_LocaleCompare",CONCAT44(extraout_var,iVar6),
                  CONCAT44(extraout_var_00,iVar8));
  }
  else {
    iVar6 = (*(right->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    iVar8 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    Output::Trace(IntlPhase,L"%S(): Calling Collator.prototype.compare(\'%s\', \'%s\')\n",
                  "EntryIntl_LocaleCompare",CONCAT44(extraout_var_01,iVar6),
                  CONCAT44(extraout_var_02,iVar8));
  }
  coll = (FinalizableUCollator *)0x0;
  pFStack_a0 = (FinalizableICUObject<UCollator_*,_&ucol_close_70> *)0x0;
  langtag._4_4_ = U_ZERO_ERROR;
  iVar6 = (*(pDStack_88->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (pDStack_88,pDStack_88,9,&coll,0,left);
  pDVar3 = pDStack_88;
  if (iVar6 == 0) {
    PropertyIds::PropertyIds(&local_b4,locale);
    _sensitivity = AssertStringProperty(pDVar3,local_b4);
    pDVar3 = pDStack_88;
    PropertyIds::PropertyIds(&local_bc,sensitivityEnum);
    CStack_b8 = AssertEnumProperty<CollatorSensitivity>(pDVar3,local_bc);
    pDVar3 = pDStack_88;
    PropertyIds::PropertyIds(&local_c4,ignorePunctuation);
    numeric = AssertBooleanProperty(pDVar3,local_c4);
    pDVar3 = pDStack_88;
    PropertyIds::PropertyIds(&local_cc,numeric);
    caseFirst._3_1_ = AssertBooleanProperty(pDVar3,local_cc);
    pDVar3 = pDStack_88;
    PropertyIds::PropertyIds((PropertyIds *)((long)&usage + 4),caseFirstEnum);
    local_d0 = AssertEnumProperty<CollatorCaseFirst>(pDVar3,usage._4_4_);
    pDVar3 = pDStack_88;
    PropertyIds::PropertyIds((PropertyIds *)(localeID + 0x9c),usage);
    pJVar13 = AssertStringProperty(pDVar3,stack0xffffffffffffff1c);
    memset(searchString + 3,0,0x9d);
    LangtagToLocaleID<157ul>(_sensitivity,(char (*) [157])(searchString + 3));
    temptempAllocator._2_2_ = L's';
    temptempAllocator._4_2_ = L'e';
    temptempAllocator._6_2_ = L'a';
    cStack_190 = L'r';
    searchString[0] = L'c';
    searchString[1] = L'h';
    searchString[2] = L'\0';
    iVar6 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x6b])(pJVar13,(long)&temptempAllocator + 2,6);
    if (iVar6 != 0) {
      uloc_setKeywordValue_70("collation","search",searchString + 3,0x9d,(long)&langtag + 4);
      if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
        Throw::OutOfMemory();
      }
      UVar5 = U_FAILURE(langtag._4_4_);
      if ((UVar5 != '\0') || (langtag._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        pCVar14 = (LPCSTR)u_errorName_70(langtag._4_4_);
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x75b,"(false)",pCVar14);
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    recycler = ScriptContext::GetRecycler((ScriptContext *)left);
    pUVar15 = (UCollator *)ucol_open_70(searchString + 3,(long)&langtag + 4);
    pFStack_a0 = FinalizableICUObject<UCollator_*,_&ucol_close_70>::New(recycler,pUVar15);
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar5 = U_FAILURE(langtag._4_4_);
    if ((UVar5 != '\0') || (langtag._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      pCVar14 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x75f,"(false)",pCVar14);
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if (CStack_b8 == Base) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setStrength_70(pUVar15,0);
    }
    else if (CStack_b8 == Accent) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setStrength_70(pUVar15,1);
    }
    else if (CStack_b8 == Case) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setStrength_70(pUVar15,0);
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setAttribute_70(pUVar15,3,0x11,(long)&langtag + 4);
    }
    else if (CStack_b8 == Default) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setStrength_70(pUVar15,2);
    }
    if ((numeric & 1U) != 0) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setAttribute_70(pUVar15,1,0x14,(long)&langtag + 4);
    }
    if ((caseFirst._3_1_ & 1) != Upper >> 0x18) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setAttribute_70(pUVar15,7,0x11,(long)&langtag + 4);
    }
    if (local_d0 == Upper) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setAttribute_70(pUVar15,2,0x19,(long)&langtag + 4);
    }
    else if (local_d0 == Lower) {
      pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_
                          ((FinalizableICUObject *)pFStack_a0);
      ucol_setAttribute_70(pUVar15,2,0x18,(long)&langtag + 4);
    }
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar5 = U_FAILURE(langtag._4_4_);
    if ((UVar5 != '\0') || (langtag._4_4_ == U_STRING_NOT_TERMINATED_WARNING)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      pCVar14 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x78b,"(false)",pCVar14);
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    pFVar2 = pFStack_a0;
    iVar6 = (*(_sensitivity->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
    Output::Trace(IntlPhase,
                  L"%S(): Caching UCollator (0x%x) with langtag = %s, sensitivity = %d, caseFirst = %d, ignorePunctuation = %d, and numeric = %d\n"
                  ,"EntryIntl_LocaleCompare",pFVar2,CONCAT44(extraout_var_03,iVar6),(ulong)CStack_b8
                  ,local_d0,(uint)(numeric & 1),(uint)(byte)(caseFirst._3_1_ & 1));
    (*(pDStack_88->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x19])(pDStack_88,9,pFStack_a0,0,0);
  }
  else {
    pFStack_a0 = coll;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UCollator (0x%x)\n",
                  "EntryIntl_LocaleCompare",coll);
  }
  tempAllocator =
       (ArenaAllocator *)
       ScriptContext::GetTemporaryAllocator((ScriptContext *)left,L"EntryIntl_LocaleCompare");
  leftNormalized =
       (char16 *)
       TempArenaAllocatorWrapper<false>::GetAllocator
                 ((TempArenaAllocatorWrapper<false> *)tempAllocator);
  pcStack_1b0 = (char16 *)0x0;
  rightNormalized._4_4_ = 0;
  iVar6 = (*(right->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  cVar9 = JavascriptString::GetLength(right);
  bVar4 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (C,(char16 *)CONCAT44(extraout_var_04,iVar6),cVar9);
  if (bVar4) {
    iVar6 = (*(right->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    pcStack_1b0 = (char16 *)CONCAT44(extraout_var_05,iVar6);
    rightNormalized._4_4_ = JavascriptString::GetLength(right);
  }
  else {
    pcStack_1b0 = JavascriptString::GetNormalizedString
                            (right,C,(ArenaAllocator *)leftNormalized,
                             (charcount_t *)((long)&rightNormalized + 4));
  }
  pcStack_1c0 = (char16 *)0x0;
  ret._4_4_ = 0;
  iVar6 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  cVar9 = JavascriptString::GetLength((JavascriptString *)state);
  bVar4 = PlatformAgnostic::UnicodeText::IsNormalizedString
                    (C,(char16 *)CONCAT44(extraout_var_06,iVar6),cVar9);
  if (bVar4) {
    iVar6 = (*(state->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])();
    pcStack_1c0 = (char16 *)CONCAT44(extraout_var_07,iVar6);
    ret._4_4_ = JavascriptString::GetLength((JavascriptString *)state);
  }
  else {
    pcStack_1c0 = JavascriptString::GetNormalizedString
                            ((JavascriptString *)state,C,(ArenaAllocator *)leftNormalized,
                             (charcount_t *)((long)&ret + 4));
  }
  pUVar15 = FinalizableICUObject::operator_cast_to_UCollator_((FinalizableICUObject *)pFStack_a0);
  nValue = ucol_strcoll_70(pUVar15,pcStack_1b0,rightNormalized._4_4_,pcStack_1c0,ret._4_4_);
  pJVar13 = left;
  bVar4 = TaggedInt::IsOverflow(nValue);
  if (bVar4) {
    local_10 = JavascriptNumber::NewInlined((double)nValue,(ScriptContext *)pJVar13);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(nValue);
  }
  ScriptContext::ReleaseTemporaryAllocator
            ((ScriptContext *)left,(TempArenaAllocatorObject *)tempAllocator);
  return local_10;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_LocaleCompare(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_WINGLOB
        AssertOrFailFastMsg(false, "platform.localeCompare should not be called in Intl-WinGlob");
        return nullptr;
#else
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 5 &&
            VarIs<JavascriptString>(args[1]) &&
            VarIs<JavascriptString>(args[2]) &&
            DynamicObject::IsBaseDynamicObject(args[3]) &&
            VarIs<JavascriptBoolean>(args[4])
        );

        JavascriptString *left = UnsafeVarTo<JavascriptString>(args[1]);
        JavascriptString *right = UnsafeVarTo<JavascriptString>(args[2]);
        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[3]);
        bool forStringPrototypeLocaleCompare = UnsafeVarTo<JavascriptBoolean>(args[4])->GetValue();
        if (forStringPrototypeLocaleCompare)
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(String_Prototype_localeCompare);
            INTL_TRACE("Calling '%s'.localeCompare('%s', ...)", left->GetSz(), right->GetSz());
        }
        else
        {
            CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Collator_Prototype_compare);
            INTL_TRACE("Calling Collator.prototype.compare('%s', '%s')", left->GetSz(), right->GetSz());
        }

        // Below, we lazy-initialize the backing UCollator on the first call to localeCompare
        // On subsequent calls, the UCollator will be cached in state.CachedUCollator
        Var cachedUCollator = nullptr;
        FinalizableUCollator *coll = nullptr;
        UErrorCode status = U_ZERO_ERROR;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUCollator, &cachedUCollator, nullptr, scriptContext))
        {
            coll = reinterpret_cast<FinalizableUCollator *>(cachedUCollator);
            INTL_TRACE("Using previously cached UCollator (0x%x)", coll);
        }
        else
        {
            // the object key is locale according to Intl spec, but its more accurately a BCP47 Language Tag, not an ICU LocaleID
            JavascriptString *langtag = AssertStringProperty(state, PropertyIds::locale);
            CollatorSensitivity sensitivity = AssertEnumProperty<CollatorSensitivity>(state, PropertyIds::sensitivityEnum);
            bool ignorePunctuation = AssertBooleanProperty(state, PropertyIds::ignorePunctuation);
            bool numeric = AssertBooleanProperty(state, PropertyIds::numeric);
            CollatorCaseFirst caseFirst = AssertEnumProperty<CollatorCaseFirst>(state, PropertyIds::caseFirstEnum);
            JavascriptString *usage = AssertStringProperty(state, PropertyIds::usage);

            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(langtag, localeID);

            const char16 searchString[] = _u("search");
            if (usage->BufferEquals(searchString, _countof(searchString) - 1)) // minus the null terminator
            {
                uloc_setKeywordValue("collation", "search", localeID, _countof(localeID), &status);
                ICU_ASSERT(status, true);
            }

            coll = FinalizableUCollator::New(scriptContext->GetRecycler(), ucol_open(localeID, &status));
            ICU_ASSERT(status, true);

            // REVIEW(jahorto): Anything that requires a status will no-op if its in a failure state
            // Thus, we can ICU_ASSERT the status once after all of the properties are set for simplicity
            if (sensitivity == CollatorSensitivity::Base)
            {
                ucol_setStrength(*coll, UCOL_PRIMARY);
            }
            else if (sensitivity == CollatorSensitivity::Accent)
            {
                ucol_setStrength(*coll, UCOL_SECONDARY);
            }
            else if (sensitivity == CollatorSensitivity::Case)
            {
                // see "description" for the caseLevel default option: http://userguide.icu-project.org/collation/customization
                ucol_setStrength(*coll, UCOL_PRIMARY);
                ucol_setAttribute(*coll, UCOL_CASE_LEVEL, UCOL_ON, &status);
            }
            else if (sensitivity == CollatorSensitivity::Variant)
            {
                ucol_setStrength(*coll, UCOL_TERTIARY);
            }

            if (ignorePunctuation)
            {
                // see http://userguide.icu-project.org/collation/customization/ignorepunct
                ucol_setAttribute(*coll, UCOL_ALTERNATE_HANDLING, UCOL_SHIFTED, &status);
            }

            if (numeric)
            {
                ucol_setAttribute(*coll, UCOL_NUMERIC_COLLATION, UCOL_ON, &status);
            }

            if (caseFirst == CollatorCaseFirst::Upper)
            {
                ucol_setAttribute(*coll, UCOL_CASE_FIRST, UCOL_UPPER_FIRST, &status);
            }
            else if (caseFirst == CollatorCaseFirst::Lower)
            {
                ucol_setAttribute(*coll, UCOL_CASE_FIRST, UCOL_LOWER_FIRST, &status);
            }

            // Ensure that collator configuration was successfull
            ICU_ASSERT(status, true);

            INTL_TRACE(
                "Caching UCollator (0x%x) with langtag = %s, sensitivity = %d, caseFirst = %d, ignorePunctuation = %d, and numeric = %d",
                coll,
                langtag->GetSz(),
                sensitivity,
                caseFirst,
                ignorePunctuation,
                numeric
            );

            // cache coll for later use (so that the condition that brought us here returns true for future calls)
            state->SetInternalProperty(
                InternalPropertyIds::CachedUCollator,
                coll,
                PropertyOperationFlags::PropertyOperation_None,
                nullptr
            );
        }

        // As of ES2015, String.prototype.localeCompare must compare canonically equivalent strings as equal
        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("EntryIntl_LocaleCompare"));

        const char16 *leftNormalized = nullptr;
        charcount_t leftNormalizedLength = 0;
        if (UnicodeText::IsNormalizedString(UnicodeText::NormalizationForm::C, left->GetSz(), left->GetLength()))
        {
            leftNormalized = left->GetSz();
            leftNormalizedLength = left ->GetLength();
        }
        else
        {
            leftNormalized = left->GetNormalizedString(UnicodeText::NormalizationForm::C, tempAllocator, leftNormalizedLength);
        }

        const char16 *rightNormalized = nullptr;
        charcount_t rightNormalizedLength = 0;
        if (UnicodeText::IsNormalizedString(UnicodeText::NormalizationForm::C, right->GetSz(), right->GetLength()))
        {
            rightNormalized = right->GetSz();
            rightNormalizedLength = right->GetLength();
        }
        else
        {
            rightNormalized = right->GetNormalizedString(UnicodeText::NormalizationForm::C, tempAllocator, rightNormalizedLength);
        }

        static_assert(UCOL_LESS == -1 && UCOL_EQUAL == 0 && UCOL_GREATER == 1, "ucol_strcoll should return values compatible with localeCompare");
        Var ret = JavascriptNumber::ToVar(ucol_strcoll(
            *coll,
            reinterpret_cast<const UChar *>(leftNormalized),
            leftNormalizedLength,
            reinterpret_cast<const UChar *>(rightNormalized),
            rightNormalizedLength
        ), scriptContext);

        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        return ret;
#endif
    }